

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O2

int SUNNonlinSolGetNumIters_FixedPoint(SUNNonlinearSolver NLS,long *niters)

{
  if (NLS != (SUNNonlinearSolver)0x0) {
    *niters = *(long *)((long)NLS->content + 0x98);
    return 0;
  }
  return -0x385;
}

Assistant:

int SUNNonlinSolGetNumIters_FixedPoint(SUNNonlinearSolver NLS, long int *niters)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL)
    return(SUN_NLS_MEM_NULL);

  /* return number of nonlinear iterations in the last solve */
  *niters = FP_CONTENT(NLS)->niters;
  return(SUN_NLS_SUCCESS);
}